

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftFvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  undefined4 *puVar1;
  bool bVar2;
  Real RVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  pointer pnVar8;
  long lVar9;
  long lVar10;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar11;
  pointer pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  undefined4 *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  undefined4 *puVar19;
  ulong uVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_4c8;
  Random *local_440;
  cpp_dec_float<200U,_int,_void> local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar21 = 0;
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_130,this);
  local_4c8.fpclass = cpp_dec_float_finite;
  local_4c8.prec_elem = 0x1c;
  local_4c8.data._M_elems[0] = 0;
  local_4c8.data._M_elems[1] = 0;
  local_4c8.data._M_elems[2] = 0;
  local_4c8.data._M_elems[3] = 0;
  local_4c8.data._M_elems[4] = 0;
  local_4c8.data._M_elems[5] = 0;
  local_4c8.data._M_elems[6] = 0;
  local_4c8.data._M_elems[7] = 0;
  local_4c8.data._M_elems[8] = 0;
  local_4c8.data._M_elems[9] = 0;
  local_4c8.data._M_elems[10] = 0;
  local_4c8.data._M_elems[0xb] = 0;
  local_4c8.data._M_elems[0xc] = 0;
  local_4c8.data._M_elems[0xd] = 0;
  local_4c8.data._M_elems[0xe] = 0;
  local_4c8.data._M_elems[0xf] = 0;
  local_4c8.data._M_elems[0x10] = 0;
  local_4c8.data._M_elems[0x11] = 0;
  local_4c8.data._M_elems[0x12] = 0;
  local_4c8.data._M_elems[0x13] = 0;
  local_4c8.data._M_elems[0x14] = 0;
  local_4c8.data._M_elems[0x15] = 0;
  local_4c8.data._M_elems[0x16] = 0;
  local_4c8.data._M_elems[0x17] = 0;
  local_4c8.data._M_elems[0x18] = 0;
  local_4c8.data._M_elems[0x19] = 0;
  local_4c8.data._M_elems._104_5_ = 0;
  local_4c8.data._M_elems[0x1b]._1_3_ = 0;
  local_4c8.exp = 0;
  local_4c8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_4c8,10.0);
  pcVar14 = &local_130;
  pcVar13 = &local_b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pcVar13->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
  }
  local_b0.exp = local_130.exp;
  local_b0.neg = local_130.neg;
  local_b0.fpclass = local_130.fpclass;
  local_b0.prec_elem = local_130.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_b0,&local_4c8);
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_2b0,this);
  local_4c8.fpclass = cpp_dec_float_finite;
  local_4c8.prec_elem = 0x1c;
  local_4c8.data._M_elems[0] = 0;
  local_4c8.data._M_elems[1] = 0;
  local_4c8.data._M_elems[2] = 0;
  local_4c8.data._M_elems[3] = 0;
  local_4c8.data._M_elems[4] = 0;
  local_4c8.data._M_elems[5] = 0;
  local_4c8.data._M_elems[6] = 0;
  local_4c8.data._M_elems[7] = 0;
  local_4c8.data._M_elems[8] = 0;
  local_4c8.data._M_elems[9] = 0;
  local_4c8.data._M_elems[10] = 0;
  local_4c8.data._M_elems[0xb] = 0;
  local_4c8.data._M_elems[0xc] = 0;
  local_4c8.data._M_elems[0xd] = 0;
  local_4c8.data._M_elems[0xe] = 0;
  local_4c8.data._M_elems[0xf] = 0;
  local_4c8.data._M_elems[0x10] = 0;
  local_4c8.data._M_elems[0x11] = 0;
  local_4c8.data._M_elems[0x12] = 0;
  local_4c8.data._M_elems[0x13] = 0;
  local_4c8.data._M_elems[0x14] = 0;
  local_4c8.data._M_elems[0x15] = 0;
  local_4c8.data._M_elems[0x16] = 0;
  local_4c8.data._M_elems[0x17] = 0;
  local_4c8.data._M_elems[0x18] = 0;
  local_4c8.data._M_elems[0x19] = 0;
  local_4c8.data._M_elems._104_5_ = 0;
  local_4c8.data._M_elems[0x1b]._1_3_ = 0;
  local_4c8.exp = 0;
  local_4c8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_4c8,100.0);
  pcVar14 = &local_2b0;
  pcVar13 = &local_130;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pcVar13->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
  }
  local_130.exp = local_2b0.exp;
  local_130.neg = local_2b0.neg;
  local_130.fpclass = local_2b0.fpclass;
  local_130.prec_elem = local_2b0.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_130,&local_4c8)
  ;
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_4c8,this);
  RVar3 = Tolerances::epsilon((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 0x1c;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems[6] = 0;
  local_438.data._M_elems[7] = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.data._M_elems[10] = 0;
  local_438.data._M_elems[0xb] = 0;
  local_438.data._M_elems[0xc] = 0;
  local_438.data._M_elems[0xd] = 0;
  local_438.data._M_elems[0xe] = 0;
  local_438.data._M_elems[0xf] = 0;
  local_438.data._M_elems[0x10] = 0;
  local_438.data._M_elems[0x11] = 0;
  local_438.data._M_elems[0x12] = 0;
  local_438.data._M_elems[0x13] = 0;
  local_438.data._M_elems[0x14] = 0;
  local_438.data._M_elems[0x15] = 0;
  local_438.data._M_elems[0x16] = 0;
  local_438.data._M_elems[0x17] = 0;
  local_438.data._M_elems[0x18] = 0;
  local_438.data._M_elems[0x19] = 0;
  local_438.data._M_elems._104_5_ = 0;
  local_438.data._M_elems[0x1b]._1_3_ = 0;
  local_438.exp = 0;
  local_438.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_438,RVar3);
  pcVar14 = &local_4c8;
  pcVar13 = &local_2b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pcVar13->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
  }
  local_2b0.exp = local_4c8.exp;
  local_2b0.neg = local_4c8.neg;
  local_2b0.fpclass = local_4c8.fpclass;
  local_2b0.prec_elem = local_4c8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_2b0,&local_438)
  ;
  uVar20 = (ulong)(this->thecovectors->set).thenum;
  if (0 < (long)uVar20) {
    local_440 = &this->random;
    lVar9 = uVar20 << 7;
    do {
      pnVar12 = (this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar9);
      local_4c8.fpclass = cpp_dec_float_finite;
      local_4c8.prec_elem = 0x1c;
      local_4c8.data._M_elems[0] = 0;
      local_4c8.data._M_elems[1] = 0;
      local_4c8.data._M_elems[2] = 0;
      local_4c8.data._M_elems[3] = 0;
      local_4c8.data._M_elems[4] = 0;
      local_4c8.data._M_elems[5] = 0;
      local_4c8.data._M_elems[6] = 0;
      local_4c8.data._M_elems[7] = 0;
      local_4c8.data._M_elems[8] = 0;
      local_4c8.data._M_elems[9] = 0;
      local_4c8.data._M_elems[10] = 0;
      local_4c8.data._M_elems[0xb] = 0;
      local_4c8.data._M_elems[0xc] = 0;
      local_4c8.data._M_elems[0xd] = 0;
      local_4c8.data._M_elems[0xe] = 0;
      local_4c8.data._M_elems[0xf] = 0;
      local_4c8.data._M_elems[0x10] = 0;
      local_4c8.data._M_elems[0x11] = 0;
      local_4c8.data._M_elems[0x12] = 0;
      local_4c8.data._M_elems[0x13] = 0;
      local_4c8.data._M_elems[0x14] = 0;
      local_4c8.data._M_elems[0x15] = 0;
      local_4c8.data._M_elems[0x16] = 0;
      local_4c8.data._M_elems[0x17] = 0;
      local_4c8.data._M_elems[0x18] = 0;
      local_4c8.data._M_elems[0x19] = 0;
      local_4c8.data._M_elems._104_5_ = 0;
      local_4c8.data._M_elems[0x1b]._1_3_ = 0;
      local_4c8.exp = 0;
      local_4c8.neg = false;
      if (pcVar14 != &local_4c8) {
        pcVar13 = &local_4c8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
        }
        local_4c8.exp = *(int *)((long)&(pnVar12->m_backend).data + lVar9 + -0x10);
        local_4c8.neg = *(bool *)((long)&(pnVar12->m_backend).data + lVar9 + -0xc);
        local_4c8._120_8_ = *(undefined8 *)((long)&(pnVar12->m_backend).data + lVar9 + -8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_4c8,&local_2b0);
      pUVar11 = this->theFvec;
      iVar6 = (int)uVar20;
      if ((local_4c8.fpclass == cpp_dec_float_NaN) ||
         (pnVar12 = (pUVar11->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)&pnVar12->m_backend + lVar9 + -8) == 2)) {
LAB_005192c3:
        pnVar12 = (pUVar11->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar8 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar8[-1].m_backend.data + lVar9);
        local_4c8.fpclass = cpp_dec_float_finite;
        local_4c8.prec_elem = 0x1c;
        local_4c8.data._M_elems[0] = 0;
        local_4c8.data._M_elems[1] = 0;
        local_4c8.data._M_elems[2] = 0;
        local_4c8.data._M_elems[3] = 0;
        local_4c8.data._M_elems[4] = 0;
        local_4c8.data._M_elems[5] = 0;
        local_4c8.data._M_elems[6] = 0;
        local_4c8.data._M_elems[7] = 0;
        local_4c8.data._M_elems[8] = 0;
        local_4c8.data._M_elems[9] = 0;
        local_4c8.data._M_elems[10] = 0;
        local_4c8.data._M_elems[0xb] = 0;
        local_4c8.data._M_elems[0xc] = 0;
        local_4c8.data._M_elems[0xd] = 0;
        local_4c8.data._M_elems[0xe] = 0;
        local_4c8.data._M_elems[0xf] = 0;
        local_4c8.data._M_elems[0x10] = 0;
        local_4c8.data._M_elems[0x11] = 0;
        local_4c8.data._M_elems[0x12] = 0;
        local_4c8.data._M_elems[0x13] = 0;
        local_4c8.data._M_elems[0x14] = 0;
        local_4c8.data._M_elems[0x15] = 0;
        local_4c8.data._M_elems[0x16] = 0;
        local_4c8.data._M_elems[0x17] = 0;
        local_4c8.data._M_elems[0x18] = 0;
        local_4c8.data._M_elems[0x19] = 0;
        local_4c8.data._M_elems._104_5_ = 0;
        local_4c8.data._M_elems[0x1b]._1_3_ = 0;
        local_4c8.exp = 0;
        local_4c8.neg = false;
        if (pcVar14 != &local_4c8) {
          pcVar13 = &local_4c8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar13->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
          }
          local_4c8.exp = *(int *)((long)&(pnVar8->m_backend).data + lVar9 + -0x10);
          local_4c8.neg = *(bool *)((long)&(pnVar8->m_backend).data + lVar9 + -0xc);
          local_4c8._120_8_ = *(undefined8 *)((long)&(pnVar8->m_backend).data + lVar9 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_4c8,&local_2b0);
        if (((*(int *)((long)&pnVar12->m_backend + lVar9 + -8) != 2) &&
            (local_4c8.fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12 + 0xffffffffffffffff) + lVar9),&local_4c8), iVar7 < 0
           )) {
          pnVar12 = (this->theLBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar9);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)((this->theFvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0xffffffffffffffff) + lVar9)
          ;
          local_438.fpclass = cpp_dec_float_finite;
          local_438.prec_elem = 0x1c;
          local_438.data._M_elems[0] = 0;
          local_438.data._M_elems[1] = 0;
          local_438.data._M_elems[2] = 0;
          local_438.data._M_elems[3] = 0;
          local_438.data._M_elems[4] = 0;
          local_438.data._M_elems[5] = 0;
          local_438.data._M_elems[6] = 0;
          local_438.data._M_elems[7] = 0;
          local_438.data._M_elems[8] = 0;
          local_438.data._M_elems[9] = 0;
          local_438.data._M_elems[10] = 0;
          local_438.data._M_elems[0xb] = 0;
          local_438.data._M_elems[0xc] = 0;
          local_438.data._M_elems[0xd] = 0;
          local_438.data._M_elems[0xe] = 0;
          local_438.data._M_elems[0xf] = 0;
          local_438.data._M_elems[0x10] = 0;
          local_438.data._M_elems[0x11] = 0;
          local_438.data._M_elems[0x12] = 0;
          local_438.data._M_elems[0x13] = 0;
          local_438.data._M_elems[0x14] = 0;
          local_438.data._M_elems[0x15] = 0;
          local_438.data._M_elems[0x16] = 0;
          local_438.data._M_elems[0x17] = 0;
          local_438.data._M_elems[0x18] = 0;
          local_438.data._M_elems[0x19] = 0;
          local_438.data._M_elems._104_5_ = 0;
          local_438.data._M_elems[0x1b]._1_3_ = 0;
          local_438.exp = 0;
          local_438.neg = false;
          if (pcVar14 == &local_438) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_438,pcVar13);
            if (local_438.data._M_elems[0] != 0 || local_438.fpclass != cpp_dec_float_finite) {
              local_438.neg = (bool)(local_438.neg ^ 1);
            }
          }
          else {
            if (pcVar13 != &local_438) {
              pcVar17 = &local_438;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar17->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4)
                ;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar21 * -8 + 4)
                ;
              }
              local_438.exp = *(int *)((long)&(pnVar12->m_backend).data + lVar9 + -0x10);
              local_438.neg = *(bool *)((long)&(pnVar12->m_backend).data + lVar9 + -0xc);
              local_438._120_8_ = *(undefined8 *)((long)&(pnVar12->m_backend).data + lVar9 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_438,pcVar14);
          }
          pcVar14 = &local_438;
          pcVar13 = &local_4c8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar13->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
          }
          local_4c8.exp = local_438.exp;
          local_4c8.neg = local_438.neg;
          local_4c8.fpclass = local_438.fpclass;
          local_4c8.prec_elem = local_438.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_4c8,&local_2b0);
          pnVar12 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)((long)&(pnVar12->m_backend).data + lVar9 + -8) != 2) &&
              (pnVar8 = (this->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar8->m_backend).data + lVar9 + -8) != 2)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)
                                 ((long)&pnVar12[-1].m_backend.data + lVar9),
                                 (cpp_dec_float<200U,_int,_void> *)
                                 ((long)&pnVar8[-1].m_backend.data + lVar9)), iVar7 == 0)) {
            pnVar12 = (this->theFvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar15 = (uint *)((long)(pnVar12 + 0xffffffffffffffff) + lVar9);
            pnVar18 = &local_230;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_230.m_backend.exp = *(int *)((long)&pnVar12->m_backend + lVar9 + -0x10);
            local_230.m_backend.neg = *(bool *)((long)&pnVar12->m_backend + lVar9 + -0xc);
            local_230.m_backend._120_8_ = *(undefined8 *)((long)&pnVar12->m_backend + lVar9 + -8);
            shiftLBbound(this,iVar6 + -1,&local_230);
            pnVar12 = (this->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar8 = (this->theLBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_00519a05;
          }
          pnVar12 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_b0);
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_130);
          RVar3 = Random::next_random(local_440);
          local_3b8.fpclass = cpp_dec_float_finite;
          local_3b8.prec_elem = 0x1c;
          local_3b8.data._M_elems[0] = 0;
          local_3b8.data._M_elems[1] = 0;
          local_3b8.data._M_elems[2] = 0;
          local_3b8.data._M_elems[3] = 0;
          local_3b8.data._M_elems[4] = 0;
          local_3b8.data._M_elems[5] = 0;
          local_3b8.data._M_elems[6] = 0;
          local_3b8.data._M_elems[7] = 0;
          local_3b8.data._M_elems[8] = 0;
          local_3b8.data._M_elems[9] = 0;
          local_3b8.data._M_elems[10] = 0;
          local_3b8.data._M_elems[0xb] = 0;
          local_3b8.data._M_elems[0xc] = 0;
          local_3b8.data._M_elems[0xd] = 0;
          local_3b8.data._M_elems[0xe] = 0;
          local_3b8.data._M_elems[0xf] = 0;
          local_3b8.data._M_elems[0x10] = 0;
          local_3b8.data._M_elems[0x11] = 0;
          local_3b8.data._M_elems[0x12] = 0;
          local_3b8.data._M_elems[0x13] = 0;
          local_3b8.data._M_elems[0x14] = 0;
          local_3b8.data._M_elems[0x15] = 0;
          local_3b8.data._M_elems[0x16] = 0;
          local_3b8.data._M_elems[0x17] = 0;
          local_3b8.data._M_elems[0x18] = 0;
          local_3b8.data._M_elems[0x19] = 0;
          local_3b8.data._M_elems._104_5_ = 0;
          local_3b8.data._M_elems[0x1b]._1_3_ = 0;
          local_3b8.exp = 0;
          local_3b8.neg = false;
          local_4c8.fpclass = cpp_dec_float_finite;
          local_4c8.prec_elem = 0x1c;
          local_4c8.data._M_elems[0] = 0;
          local_4c8.data._M_elems[1] = 0;
          local_4c8.data._M_elems[2] = 0;
          local_4c8.data._M_elems[3] = 0;
          local_4c8.data._M_elems[4] = 0;
          local_4c8.data._M_elems[5] = 0;
          local_4c8.data._M_elems[6] = 0;
          local_4c8.data._M_elems[7] = 0;
          local_4c8.data._M_elems[8] = 0;
          local_4c8.data._M_elems[9] = 0;
          local_4c8.data._M_elems[10] = 0;
          local_4c8.data._M_elems[0xb] = 0;
          local_4c8.data._M_elems[0xc] = 0;
          local_4c8.data._M_elems[0xd] = 0;
          local_4c8.data._M_elems[0xe] = 0;
          local_4c8.data._M_elems[0xf] = 0;
          local_4c8.data._M_elems[0x10] = 0;
          local_4c8.data._M_elems[0x11] = 0;
          local_4c8.data._M_elems[0x12] = 0;
          local_4c8.data._M_elems[0x13] = 0;
          local_4c8.data._M_elems[0x14] = 0;
          local_4c8.data._M_elems[0x15] = 0;
          local_4c8.data._M_elems[0x16] = 0;
          local_4c8.data._M_elems[0x17] = 0;
          local_4c8.data._M_elems[0x18] = 0;
          local_4c8.data._M_elems[0x19] = 0;
          local_4c8.data._M_elems._104_5_ = 0;
          local_4c8.data._M_elems[0x1b]._1_3_ = 0;
          local_4c8.exp = 0;
          local_4c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_4c8,
                     RVar3 * dVar5 + (1.0 - RVar3) * dVar4);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar12 + 0xffffffffffffffff) + lVar9) !=
              &local_3b8) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar12 + 0xffffffffffffffff) + lVar9);
            pcVar13 = &local_3b8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
            }
            local_3b8.exp = *(int *)((long)&pnVar12->m_backend + lVar9 + -0x10);
            local_3b8.neg = *(bool *)((long)&pnVar12->m_backend + lVar9 + -0xc);
            local_3b8._120_8_ = *(undefined8 *)((long)&pnVar12->m_backend + lVar9 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_3b8,&local_4c8);
          shiftLBbound(this,iVar6 + -1,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_3b8);
        }
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_4c8,
                           (cpp_dec_float<200U,_int,_void> *)
                           ((long)(pnVar12 + 0xffffffffffffffff) + lVar9));
        pUVar11 = this->theFvec;
        if (-1 < iVar7) goto LAB_005192c3;
        pnVar12 = (pUVar11->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)(pnVar12 + 0xffffffffffffffff) + lVar9);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9);
        local_438.fpclass = cpp_dec_float_finite;
        local_438.prec_elem = 0x1c;
        local_438.data._M_elems[0] = 0;
        local_438.data._M_elems[1] = 0;
        local_438.data._M_elems[2] = 0;
        local_438.data._M_elems[3] = 0;
        local_438.data._M_elems[4] = 0;
        local_438.data._M_elems[5] = 0;
        local_438.data._M_elems[6] = 0;
        local_438.data._M_elems[7] = 0;
        local_438.data._M_elems[8] = 0;
        local_438.data._M_elems[9] = 0;
        local_438.data._M_elems[10] = 0;
        local_438.data._M_elems[0xb] = 0;
        local_438.data._M_elems[0xc] = 0;
        local_438.data._M_elems[0xd] = 0;
        local_438.data._M_elems[0xe] = 0;
        local_438.data._M_elems[0xf] = 0;
        local_438.data._M_elems[0x10] = 0;
        local_438.data._M_elems[0x11] = 0;
        local_438.data._M_elems[0x12] = 0;
        local_438.data._M_elems[0x13] = 0;
        local_438.data._M_elems[0x14] = 0;
        local_438.data._M_elems[0x15] = 0;
        local_438.data._M_elems[0x16] = 0;
        local_438.data._M_elems[0x17] = 0;
        local_438.data._M_elems[0x18] = 0;
        local_438.data._M_elems[0x19] = 0;
        local_438.data._M_elems._104_5_ = 0;
        local_438.data._M_elems[0x1b]._1_3_ = 0;
        local_438.exp = 0;
        local_438.neg = false;
        if (pcVar14 == &local_438) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_438,pcVar13);
          if (local_438.data._M_elems[0] != 0 || local_438.fpclass != cpp_dec_float_finite) {
            local_438.neg = (bool)(local_438.neg ^ 1);
          }
        }
        else {
          if (pcVar13 != &local_438) {
            pcVar17 = &local_438;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar21 * -8 + 4);
            }
            local_438.exp = *(int *)((long)&pnVar12->m_backend + lVar9 + -0x10);
            local_438.neg = *(bool *)((long)&pnVar12->m_backend + lVar9 + -0xc);
            local_438._120_8_ = *(undefined8 *)((long)&pnVar12->m_backend + lVar9 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_438,pcVar14);
        }
        pcVar14 = &local_438;
        pcVar13 = &local_4c8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
        }
        local_4c8.exp = local_438.exp;
        local_4c8.neg = local_438.neg;
        local_4c8.fpclass = local_438.fpclass;
        local_4c8.prec_elem = local_438.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_4c8,&local_2b0);
        pnVar12 = (this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)&(pnVar12->m_backend).data + lVar9 + -8) == 2) ||
            (pnVar8 = (this->theLBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&(pnVar8->m_backend).data + lVar9 + -8) == 2)) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar12[-1].m_backend.data + lVar9),
                               (cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar8[-1].m_backend.data + lVar9)), iVar7 != 0)) {
          pnVar12 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_b0);
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_130);
          RVar3 = Random::next_random(local_440);
          local_338.fpclass = cpp_dec_float_finite;
          local_338.prec_elem = 0x1c;
          local_338.data._M_elems[0] = 0;
          local_338.data._M_elems[1] = 0;
          local_338.data._M_elems[2] = 0;
          local_338.data._M_elems[3] = 0;
          local_338.data._M_elems[4] = 0;
          local_338.data._M_elems[5] = 0;
          local_338.data._M_elems[6] = 0;
          local_338.data._M_elems[7] = 0;
          local_338.data._M_elems[8] = 0;
          local_338.data._M_elems[9] = 0;
          local_338.data._M_elems[10] = 0;
          local_338.data._M_elems[0xb] = 0;
          local_338.data._M_elems[0xc] = 0;
          local_338.data._M_elems[0xd] = 0;
          local_338.data._M_elems[0xe] = 0;
          local_338.data._M_elems[0xf] = 0;
          local_338.data._M_elems[0x10] = 0;
          local_338.data._M_elems[0x11] = 0;
          local_338.data._M_elems[0x12] = 0;
          local_338.data._M_elems[0x13] = 0;
          local_338.data._M_elems[0x14] = 0;
          local_338.data._M_elems[0x15] = 0;
          local_338.data._M_elems[0x16] = 0;
          local_338.data._M_elems[0x17] = 0;
          local_338.data._M_elems[0x18] = 0;
          local_338.data._M_elems[0x19] = 0;
          local_338.data._M_elems._104_5_ = 0;
          local_338.data._M_elems[0x1b]._1_3_ = 0;
          local_338.exp = 0;
          local_338.neg = false;
          local_4c8.fpclass = cpp_dec_float_finite;
          local_4c8.prec_elem = 0x1c;
          local_4c8.data._M_elems[0] = 0;
          local_4c8.data._M_elems[1] = 0;
          local_4c8.data._M_elems[2] = 0;
          local_4c8.data._M_elems[3] = 0;
          local_4c8.data._M_elems[4] = 0;
          local_4c8.data._M_elems[5] = 0;
          local_4c8.data._M_elems[6] = 0;
          local_4c8.data._M_elems[7] = 0;
          local_4c8.data._M_elems[8] = 0;
          local_4c8.data._M_elems[9] = 0;
          local_4c8.data._M_elems[10] = 0;
          local_4c8.data._M_elems[0xb] = 0;
          local_4c8.data._M_elems[0xc] = 0;
          local_4c8.data._M_elems[0xd] = 0;
          local_4c8.data._M_elems[0xe] = 0;
          local_4c8.data._M_elems[0xf] = 0;
          local_4c8.data._M_elems[0x10] = 0;
          local_4c8.data._M_elems[0x11] = 0;
          local_4c8.data._M_elems[0x12] = 0;
          local_4c8.data._M_elems[0x13] = 0;
          local_4c8.data._M_elems[0x14] = 0;
          local_4c8.data._M_elems[0x15] = 0;
          local_4c8.data._M_elems[0x16] = 0;
          local_4c8.data._M_elems[0x17] = 0;
          local_4c8.data._M_elems[0x18] = 0;
          local_4c8.data._M_elems[0x19] = 0;
          local_4c8.data._M_elems._104_5_ = 0;
          local_4c8.data._M_elems[0x1b]._1_3_ = 0;
          local_4c8.exp = 0;
          local_4c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_4c8,
                     RVar3 * dVar5 + (1.0 - RVar3) * dVar4);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar12 + 0xffffffffffffffff) + lVar9) !=
              &local_338) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar12 + 0xffffffffffffffff) + lVar9);
            pcVar13 = &local_338;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
            }
            local_338.exp = *(int *)((long)&pnVar12->m_backend + lVar9 + -0x10);
            local_338.neg = *(bool *)((long)&pnVar12->m_backend + lVar9 + -0xc);
            local_338._120_8_ = *(undefined8 *)((long)&pnVar12->m_backend + lVar9 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_338,&local_4c8);
          shiftUBbound(this,iVar6 + -1,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_338);
        }
        else {
          pnVar12 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar15 = (uint *)((long)(pnVar12 + 0xffffffffffffffff) + lVar9);
          pnVar18 = &local_1b0;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = *(int *)((long)&pnVar12->m_backend + lVar9 + -0x10);
          local_1b0.m_backend.neg = *(bool *)((long)&pnVar12->m_backend + lVar9 + -0xc);
          local_1b0.m_backend._120_8_ = *(undefined8 *)((long)&pnVar12->m_backend + lVar9 + -8);
          shiftUBbound(this,iVar6 + -1,&local_1b0);
          pnVar8 = (this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = (this->theLBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_00519a05:
          puVar1 = (undefined4 *)((long)&pnVar12[-1].m_backend.data + lVar9);
          puVar16 = (undefined4 *)((long)&pnVar8[-1].m_backend.data + lVar9);
          puVar19 = puVar1;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar19 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
            puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
          }
          puVar1[0x1c] = *(undefined4 *)((long)&(pnVar8->m_backend).data + lVar9 + -0x10);
          *(undefined1 *)(puVar1 + 0x1d) =
               *(undefined1 *)((long)&(pnVar8->m_backend).data + lVar9 + -0xc);
          *(undefined8 *)(puVar1 + 0x1e) =
               *(undefined8 *)((long)&(pnVar8->m_backend).data + lVar9 + -8);
        }
      }
      lVar9 = lVar9 + -0x80;
      bVar2 = 1 < uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftFvec()
{

   /* the allowed tolerance is (rep() == COLUMN) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because theFvec is the primal VectorBase<R> in COLUMN
    * and the dual VectorBase<R> in ROW representation; this is equivalent to entertol()
    */
   R minrandom = 10.0 * entertol();
   R maxrandom = 100.0 * entertol();
   R allow = entertol() - epsilon();

   assert(type() == ENTER);
   assert(allow > 0);

   for(int i = dim() - 1; i >= 0; --i)
   {
      if(theUBbound[i] + allow < (*theFvec)[i])
      {
         SPxOut::debug(this, "DSHIFT08 theUBbound[{}] violated by {}", i,
                       (*theFvec)[i] - theUBbound[i] - allow);

         if(theUBbound[i] != theLBbound[i])
         {
            // since minrandom and maxrandom are of the order 10 different,
            // we currently doesn't care about higher precision random
            // numbers. Hence the cast to double.
            shiftUBbound(i, (*theFvec)[i] + random.next((double)minrandom, (double)maxrandom));
         }
         else
         {
            shiftUBbound(i, (*theFvec)[i]);
            theLBbound[i] = theUBbound[i];
         }
      }
      else if((*theFvec)[i] < theLBbound[i] - allow)
      {
         SPxOut::debug(this, "DSHIFT08 theLBbound[{}] violated by {}", i,
                       theLBbound[i] - (*theFvec)[i] - allow);

         if(theUBbound[i] != theLBbound[i])
            shiftLBbound(i, (*theFvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLBbound(i, (*theFvec)[i]);
            theUBbound[i] = theLBbound[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT01 shiftFvec: OK\n");
#endif
}